

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O0

ssize_t __thiscall
libchars::terminal_driver::write(terminal_driver *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  ssize_t sVar2;
  int *piVar3;
  undefined4 in_register_00000034;
  ssize_t n;
  char *seqend;
  size_t seqlen_local;
  char *sequence_local;
  terminal_driver *this_local;
  
  seqlen_local = CONCAT44(in_register_00000034,__fd);
  uVar1 = seqlen_local + (long)__buf;
  while( true ) {
    while( true ) {
      if (uVar1 <= seqlen_local) {
        this_local._4_4_ = 0;
        goto LAB_0013a2be;
      }
      sVar2 = ::write(this->fd_w,(void *)seqlen_local,uVar1 - seqlen_local);
      if (sVar2 < 1) break;
      seqlen_local = sVar2 + seqlen_local;
    }
    if (sVar2 == 0) break;
    piVar3 = __errno_location();
    if ((*piVar3 != 4) && (piVar3 = __errno_location(), *piVar3 != 0xb)) {
      this_local._4_4_ = 0xffffffff;
LAB_0013a2be:
      return (ulong)this_local._4_4_;
    }
  }
  this_local._4_4_ = 0xffffffff;
  goto LAB_0013a2be;
}

Assistant:

int terminal_driver::write(const char *sequence, size_t seqlen)
    {
        const char *const seqend = sequence + seqlen;

        while (sequence < seqend) {
            ssize_t n = ::write(fd_w, sequence, (size_t)(seqend - sequence));
            if (n > 0) {
                sequence += n;
            }
            else {
                if (n == 0)
                    return -1;
                if (errno != EINTR && errno != EWOULDBLOCK)
                    return -1;
            }
        }
        return 0;
    }